

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O3

int * Fra_ClauCreateMapping(Vec_Int_t *vSatVarsFrom,Vec_Int_t *vSatVarsTo,int nVarsMax)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int *__s;
  ulong uVar4;
  
  uVar1 = vSatVarsFrom->nSize;
  if (uVar1 != vSatVarsTo->nSize) {
    __assert_fail("Vec_IntSize(vSatVarsFrom) == Vec_IntSize(vSatVarsTo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                  ,0x9d,"int *Fra_ClauCreateMapping(Vec_Int_t *, Vec_Int_t *, int)");
  }
  __s = (int *)malloc((long)nVarsMax * 4);
  if (0 < nVarsMax) {
    memset(__s,0xff,(ulong)(uint)nVarsMax << 2);
  }
  if (0 < (int)uVar1) {
    piVar2 = vSatVarsFrom->pArray;
    piVar3 = vSatVarsTo->pArray;
    uVar4 = 0;
    do {
      if (uVar1 == uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      __s[piVar2[uVar4]] = piVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return __s;
}

Assistant:

int * Fra_ClauCreateMapping( Vec_Int_t * vSatVarsFrom, Vec_Int_t * vSatVarsTo, int nVarsMax )
{
    int * pMapping, Var, i;
    assert( Vec_IntSize(vSatVarsFrom) == Vec_IntSize(vSatVarsTo) );
    pMapping = ABC_ALLOC( int, nVarsMax );
    for ( i = 0; i < nVarsMax; i++ )
        pMapping[i] = -1;
    Vec_IntForEachEntry( vSatVarsFrom, Var, i )
        pMapping[Var] = Vec_IntEntry(vSatVarsTo,i);
    return pMapping;
}